

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

FState * __thiscall FStateDefinitions::FindState(FStateDefinitions *this,char *name)

{
  FStateDefine *pFVar1;
  FState *pFVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  MakeStateNameList(name);
  if ((ulong)MakeStateNameList::namelist.Count == 0) {
    pFVar2 = (FState *)0x0;
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = (ulong)(this->StateLabels).Count;
      if (uVar4 == 0) {
        return (FState *)0x0;
      }
      pFVar1 = (this->StateLabels).Array;
      lVar5 = 0;
      while (*(int *)((long)&(pFVar1->Label).Index + lVar5) !=
             MakeStateNameList::namelist.Array[uVar3].Index) {
        lVar5 = lVar5 + 0x28;
        if (uVar4 * 0x28 == lVar5) {
          return (FState *)0x0;
        }
      }
      this = (FStateDefinitions *)((long)&(pFVar1->Children).Array + lVar5);
      uVar3 = uVar3 + 1;
    } while (uVar3 != MakeStateNameList::namelist.Count);
    pFVar2 = *(FState **)((long)&pFVar1->State + lVar5);
  }
  return pFVar2;
}

Assistant:

FState *FStateDefinitions::FindState(const char * name)
{
	FStateDefine *statedef = NULL;

	TArray<FName> &namelist = MakeStateNameList(name);

	TArray<FStateDefine> *statelist = &StateLabels;
	for(unsigned i = 0; i < namelist.Size(); i++)
	{
		statedef = FindStateLabelInList(*statelist, namelist[i], false);
		if (statedef == NULL)
		{
			return NULL;
		}
		statelist = &statedef->Children;
	}
	return statedef ? statedef->State : NULL;
}